

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::Option<Catch::TagAlias>::Option(Option<Catch::TagAlias> *this,TagAlias *_value)

{
  TagAlias *in_RSI;
  TagAlias *in_RDI;
  undefined1 *puVar1;
  
  puVar1 = &in_RDI->field_0x8;
  TagAlias::TagAlias(in_RSI,in_RDI);
  *(undefined1 **)in_RDI = puVar1;
  return;
}

Assistant:

Option( T const& _value )
        : nullableValue( new( storage ) T( _value ) )
        {}